

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLayerNormalizationNoGammaOrBeta(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *this;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  LayerUnion LVar13;
  ostream *poVar14;
  string *psVar15;
  long lVar16;
  WeightParams *pWVar17;
  float *pfVar18;
  undefined8 *puVar19;
  int iVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar22;
  uint uVar23;
  Model m;
  Result res2;
  Result res1;
  Model MStack_a8;
  Result local_78;
  Result local_50;
  
  CoreML::Specification::Model::Model(&MStack_a8,(Arena *)0x0,false);
  if (MStack_a8.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_a8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001987d2:
    pRVar21 = &(MStack_a8.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar20 = ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_001987d2;
    ((MStack_a8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar12 = pRVar3->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar19);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar23 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 5;
  }
  uVar23 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_a8.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_a8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019898f:
    pRVar21 = &(MStack_a8.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar20 = ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_0019898f;
    ((MStack_a8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar12 = pRVar3->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar19);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar23 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 5;
  }
  uVar23 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar23] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_a8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_a8);
    MStack_a8._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_a8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_a8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (MStack_a8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_a8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00198b6a:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_a8.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar10);
  }
  else {
    iVar20 = (MStack_a8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_00198b6a;
    (MStack_a8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar20 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar20];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00198ba2:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar20 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_00198ba2;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar12 = pRVar3->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00198bf2:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar20 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar20) goto LAB_00198bf2;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar12 = pRVar3->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  if (pNVar10->_oneof_case_[0] == 0x546) {
    LVar13 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x546;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar13.layernormalization_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::LayerNormalizationLayerParams>(pAVar22);
    (pNVar10->layer_).layernormalization_ = (LayerNormalizationLayerParams *)LVar13;
  }
  pRVar1 = &(LVar13.reshape_)->targetshape_;
  uVar2 = ((RepeatedField<long> *)&(LVar13.convolution_)->kernelsize_)->current_size_;
  if (uVar2 == ((RepeatedField<long> *)&(LVar13.convolution_)->kernelsize_)->total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 1;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 1;
  }
  pRVar1->current_size_ = uVar2 + 1;
  CoreML::validate<(MLModelType)500>(&local_50,&MStack_a8);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  else {
    psVar15 = CoreML::Result::message_abi_cxx11_(&local_50);
    lVar16 = std::__cxx11::string::find((char *)psVar15,0x398165,0);
    if (lVar16 != -1) {
      pWVar17 = (LVar13.batchnorm_)->variance_;
      if (pWVar17 == (WeightParams *)0x0) {
        uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
        pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
        if ((uVar4 & 1) != 0) {
          pAVar22 = *(Arena **)pAVar22;
        }
        pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar22);
        (LVar13.batchnorm_)->variance_ = pWVar17;
      }
      this = &pWVar17->floatvalue_;
      uVar2 = (pWVar17->floatvalue_).current_size_;
      if (uVar2 == (pWVar17->floatvalue_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(this,uVar2 + 1);
        pfVar18 = google::protobuf::RepeatedField<float>::elements(this);
        pfVar18[uVar2] = 1.0;
      }
      else {
        pfVar18 = google::protobuf::RepeatedField<float>::elements(this);
        pfVar18[uVar2] = 1.0;
      }
      this->current_size_ = uVar2 + 1;
      CoreML::validate<(MLModelType)500>(&local_78,&MStack_a8);
      bVar5 = CoreML::Result::good(&local_78);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
LAB_00199028:
        std::ostream::put((char)poVar14);
        iVar20 = 1;
        std::ostream::flush();
      }
      else {
        psVar15 = CoreML::Result::message_abi_cxx11_(&local_78);
        iVar20 = 0;
        lVar16 = std::__cxx11::string::find((char *)psVar15,0x39819d,0);
        if (lVar16 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"res2.message().find(\"Beta\") != std::string::npos",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          goto LAB_00199028;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
        operator_delete(local_78.m_message._M_dataplus._M_p,
                        local_78.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0019905b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16e2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"res1.message().find(\"Gamma\") != std::string::npos",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar20 = 1;
  std::ostream::flush();
LAB_0019905b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_a8);
  return iVar20;
}

Assistant:

int testInvalidLayerNormalizationNoGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    // not specifying the gamma parameter
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Gamma") != std::string::npos);

    // not specifying the beta parameter
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("Beta") != std::string::npos);

    return 0;

}